

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateFrameworkInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,string *fname)

{
  ScopePushPop SVar1;
  cmValue outfile;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  cmNewLineStyle local_340;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  string_view local_2a0;
  allocator<char> local_289;
  string local_288;
  ScopePushPop local_268;
  ScopePushPop varScope;
  cmMakefile *mf;
  string local_250;
  undefined1 local_230 [8];
  ostringstream e;
  undefined1 local_b8 [8];
  string inMod;
  undefined1 local_88 [8];
  string inFile;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue in;
  string *fname_local;
  string *targetName_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  in.Value = fname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"MACOSX_FRAMEWORK_INFO_PLIST",&local_51);
  local_30 = cmGeneratorTarget::GetProperty(target,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar2 = cmNonempty(local_30);
  inMod.field_2._M_local_buf[0xe] = '\0';
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::string((string *)local_88,(string *)psVar5);
  }
  else {
    std::allocator<char>::allocator();
    inMod.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"MacOSXFrameworkInfo.plist.in",
               (allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  }
  if ((inMod.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_88);
  if (!bVar2) {
    cmMakefile::GetModulesFile((string *)local_b8,this->Makefile,(string *)local_88);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_b8);
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  bVar2 = cmsys::SystemTools::FileExists((string *)local_88,true);
  if (bVar2) {
    varScope.Makefile = this->Makefile;
    cmMakefile::ScopePushPop::ScopePushPop(&local_268,varScope.Makefile);
    SVar1.Makefile = varScope.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"MACOSX_FRAMEWORK_NAME",&local_289);
    local_2a0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)targetName);
    cmMakefile::AddDefinition(SVar1.Makefile,&local_288,local_2a0);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"MACOSX_FRAMEWORK_ICON_FILE",&local_2c1);
    cmLGInfoProp(SVar1.Makefile,target,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"MACOSX_FRAMEWORK_IDENTIFIER",&local_2e9);
    cmLGInfoProp(SVar1.Makefile,target,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"MACOSX_FRAMEWORK_SHORT_VERSION_STRING",&local_311);
    cmLGInfoProp(SVar1.Makefile,target,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"MACOSX_FRAMEWORK_BUNDLE_VERSION",&local_339);
    cmLGInfoProp(SVar1.Makefile,target,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    outfile = in;
    SVar1 = varScope;
    cmNewLineStyle::cmNewLineStyle(&local_340);
    cmMakefile::ConfigureFile
              (SVar1.Makefile,(string *)local_88,outfile.Value,false,false,false,0,local_340);
    cmMakefile::ScopePushPop::~ScopePushPop(&local_268);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    poVar4 = std::operator<<((ostream *)local_230,"Target ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," Info.plist template \"");
    poVar4 = std::operator<<(poVar4,(string *)local_88);
    std::operator<<(poVar4,"\" could not be found.");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  }
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void cmLocalGenerator::GenerateFrameworkInfoPList(
  cmGeneratorTarget* target, const std::string& targetName,
  const std::string& fname)
{
  // Find the Info.plist template.
  cmValue in = target->GetProperty("MACOSX_FRAMEWORK_INFO_PLIST");
  std::string inFile = cmNonempty(in) ? *in : "MacOSXFrameworkInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile)) {
    std::string inMod = this->Makefile->GetModulesFile(inFile);
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile, true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_FRAMEWORK_NAME", targetName);
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_BUNDLE_VERSION");
  mf->ConfigureFile(inFile, fname, false, false, false);
}